

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_alloc.c
# Opt level: O0

void dwarf_dealloc_attribute(Dwarf_Attribute attr)

{
  Dwarf_Debug dbg;
  Dwarf_Attribute attr_local;
  
  if (attr != (Dwarf_Attribute)0x0) {
    dwarf_dealloc(attr->ar_dbg,attr,10);
  }
  return;
}

Assistant:

void
dwarf_dealloc_attribute(Dwarf_Attribute attr)
{
    Dwarf_Debug dbg = 0;

    if (!attr) {
#ifdef DEBUG_ALLOC
        printf("DEALLOC does nothing, attr is NULL line %d %s\n",
            __LINE__,__FILE__);
        fflush(stdout);
#endif /* DEBUG_ALLOC */
        return;
    }
    dbg = attr->ar_dbg;
    dwarf_dealloc(dbg,attr,DW_DLA_ATTR);
}